

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

string * units::clean_unit_string(string *propUnitString,uint32_t commodity)

{
  bool bVar1;
  int iVar2;
  const_iterator pvVar3;
  __tuple_element_t<2UL,_tuple<const_char_*,_const_char_*,_int,_int>_> *p_Var4;
  size_type sVar5;
  reference pvVar6;
  size_type sVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  size_type sVar8;
  uint in_EDX;
  string *in_RSI;
  string *in_RDI;
  precise_unit pVar9;
  precise_unit pVar10;
  size_type locp_1;
  precise_unit rs_2;
  size_type loc_1;
  precise_unit rs_1;
  size_type locp;
  precise_unit rs;
  size_type loc;
  string cString;
  size_type fnd;
  value_type *pseq;
  const_iterator __end1;
  const_iterator __begin1;
  array<std::tuple<const_char_*,_const_char_*,_int,_int>,_11UL> *__range1;
  undefined7 in_stack_fffffffffffffe18;
  char in_stack_fffffffffffffe1f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe28;
  undefined7 in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe37;
  __const_iterator in_stack_fffffffffffffe38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe40;
  __const_iterator in_stack_fffffffffffffe48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe50;
  undefined7 in_stack_fffffffffffffe58;
  undefined1 in_stack_fffffffffffffe5f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  size_type in_stack_fffffffffffffe98;
  char detect;
  string *in_stack_fffffffffffffea0;
  undefined8 in_stack_fffffffffffffee8;
  uint32_t commodity_00;
  size_type local_40;
  const_iterator local_28;
  
  local_28 = std::array<std::tuple<const_char_*,_const_char_*,_int,_int>,_11UL>::begin
                       ((array<std::tuple<const_char_*,_const_char_*,_int,_int>,_11UL> *)0x6b07d4);
  pvVar3 = std::array<std::tuple<const_char_*,_const_char_*,_int,_int>,_11UL>::end
                     ((array<std::tuple<const_char_*,_const_char_*,_int,_int>,_11UL> *)0x6b07e8);
  while( true ) {
    commodity_00 = (uint32_t)((ulong)in_stack_fffffffffffffee8 >> 0x20);
    detect = (char)(in_stack_fffffffffffffe98 >> 0x38);
    if (local_28 == pvVar3) break;
    std::get<0ul,char_const*,char_const*,int,int>
              ((tuple<const_char_*,_const_char_*,_int,_int> *)0x6b0823);
    local_40 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                         (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38._M_current,
                          CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30));
    while (local_40 != 0xffffffffffffffff) {
      p_Var4 = std::get<2ul,char_const*,char_const*,int,int>
                         ((tuple<const_char_*,_const_char_*,_int,_int> *)0x6b086b);
      in_stack_fffffffffffffea0 = (string *)(long)*p_Var4;
      std::get<1ul,char_const*,char_const*,int,int>
                ((tuple<const_char_*,_const_char_*,_int,_int> *)0x6b0883);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                (in_stack_fffffffffffffe50,(size_type)in_stack_fffffffffffffe48._M_current,
                 (size_type)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38._M_current);
      std::get<0ul,char_const*,char_const*,int,int>
                ((tuple<const_char_*,_const_char_*,_int,_int> *)0x6b08b0);
      std::get<3ul,char_const*,char_const*,int,int>
                ((tuple<const_char_*,_const_char_*,_int,_int> *)0x6b08d8);
      sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                        (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38._M_current,
                         CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30));
      in_stack_fffffffffffffe98 = local_40;
      local_40 = sVar5;
    }
    local_28 = local_28 + 1;
  }
  bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6b0930);
  if (!bVar1) {
    pvVar6 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             front(in_stack_fffffffffffffe20);
    if (((*pvVar6 == '(') &&
        (pvVar6 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::back
                            (in_stack_fffffffffffffe20), *pvVar6 == ')')) &&
       (sVar7 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::find_first_of(in_stack_fffffffffffffe20,in_stack_fffffffffffffe1f,0x6b097d),
       sVar7 == 0xffffffffffffffff)) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                (in_stack_fffffffffffffe20);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffffe20,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
                 in_stack_fffffffffffffe38);
    }
    sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                      (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38._M_current,
                       CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30));
    if (sVar5 != 0xffffffffffffffff) {
      reduce_number_length(in_stack_fffffffffffffea0,detect);
    }
    sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                      (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38._M_current,
                       CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30));
    if (sVar5 != 0xffffffffffffffff) {
      reduce_number_length(in_stack_fffffffffffffea0,detect);
    }
  }
  if ((in_EDX == 0) &&
     (bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6b0a52),
     !bVar1)) {
    pvVar6 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             front(in_stack_fffffffffffffe20);
    bVar1 = isDigitCharacter(*pvVar6);
    if (!bVar1) {
      std::__cxx11::string::string
                (in_stack_fffffffffffffe60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
      return in_RDI;
    }
  }
  pVar9._8_8_ = in_stack_fffffffffffffe60;
  pVar9.multiplier_ = (double)in_stack_fffffffffffffe68;
  if (in_EDX != 0) {
    getCommodityName_abi_cxx11_(commodity_00);
    iVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            compare(in_stack_fffffffffffffe50,(size_type)in_stack_fffffffffffffe48._M_current,
                    (size_type)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38._M_current);
    if (iVar2 != 0) {
      escapeString((string *)in_stack_fffffffffffffe20);
    }
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffffe20,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe40,in_stack_fffffffffffffe48,
               (char)((ulong)in_stack_fffffffffffffe38._M_current >> 0x38));
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
               (char)((ulong)in_stack_fffffffffffffe28 >> 0x38));
    if ((in_EDX & 0x80000000) == 0) {
      sVar7 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              find_last_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffe40,in_stack_fffffffffffffe38._M_current,
                           CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30));
      if (sVar7 == 0xffffffffffffffff) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator+=(in_stack_fffffffffffffe20,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
        pVar9._8_8_ = in_stack_fffffffffffffe60;
        pVar9.multiplier_ = (double)in_stack_fffffffffffffe68;
      }
      else {
        iVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::compare(in_stack_fffffffffffffe50,(size_type)in_stack_fffffffffffffe48._M_current,
                          (size_type)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38._M_current)
        ;
        if (iVar2 == 0) {
          pVar9 = checkForCustomUnit(in_RSI);
          in_stack_fffffffffffffe5f =
               is_error((precise_unit *)
                        CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30));
          if (!(bool)in_stack_fffffffffffffe5f) {
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            insert((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
                   (size_type)in_stack_fffffffffffffe28,(size_type)in_stack_fffffffffffffe20,
                   in_stack_fffffffffffffe1f);
          }
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6b0ca8);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          replace(in_stack_fffffffffffffe50,(size_type)in_stack_fffffffffffffe48._M_current,
                  (size_type)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38._M_current);
        }
        else {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          find_first_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        in_stack_fffffffffffffe40,in_stack_fffffffffffffe38._M_current,
                        CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30));
          pvVar6 = CLI::std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                             (in_stack_fffffffffffffe20,
                              CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
          if ((*pvVar6 == '^') &&
             (__lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CLI::std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                                (in_stack_fffffffffffffe20,
                                 CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18)),
             *(char *)&(__lhs->_M_dataplus)._M_p == '-')) {
            pVar9 = checkForCustomUnit(in_RSI);
            bVar1 = is_error((precise_unit *)
                             CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30));
            if (!bVar1) {
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              insert((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(bVar1,in_stack_fffffffffffffe30),(size_type)in_stack_fffffffffffffe28,
                     (size_type)in_stack_fffffffffffffe20,in_stack_fffffffffffffe1f);
            }
            std::operator+(__lhs,(char *)pVar9.multiplier_);
            std::operator+(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT44(iVar2,in_stack_fffffffffffffe70),in_stack_fffffffffffffe68);
            std::__cxx11::string::~string(in_stack_fffffffffffffe20);
            std::__cxx11::string::~string(in_stack_fffffffffffffe20);
          }
          else {
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            insert((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffe40,(size_type)in_stack_fffffffffffffe38._M_current,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30));
          }
          pVar9._8_8_ = in_stack_fffffffffffffe60;
          pVar9.multiplier_ = (double)in_stack_fffffffffffffe68;
        }
      }
      pVar10._8_8_ = in_stack_fffffffffffffe20;
      pVar10.multiplier_ = (double)in_stack_fffffffffffffe28;
    }
    else {
      sVar7 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              find_last_of(in_stack_fffffffffffffe20,in_stack_fffffffffffffe1f,0x6b0e89);
      if (sVar7 == 0xffffffffffffffff) {
        pVar10 = checkForCustomUnit(in_RSI);
        bVar1 = is_error((precise_unit *)
                         CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30));
        if (!bVar1) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          insert((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
                 (size_type)pVar10.multiplier_,pVar10._8_8_,bVar1);
        }
        bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x6b0f1f);
        if (bVar1) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
                    pVar10.multiplier_._7_1_);
        }
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
                  pVar10.multiplier_._7_1_);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   pVar10.multiplier_);
      }
      else {
        sVar8 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::find_last_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffffe40,in_stack_fffffffffffffe38._M_current,
                               CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30));
        if ((sVar8 == 0xffffffffffffffff) || (sVar8 < sVar7)) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
                 in_stack_fffffffffffffe28);
        }
        else {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          insert((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe40,(size_type)in_stack_fffffffffffffe38._M_current,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30));
        }
        pVar10._8_8_ = in_stack_fffffffffffffe20;
        pVar10.multiplier_ = (double)in_stack_fffffffffffffe28;
      }
      pVar9._8_8_ = in_stack_fffffffffffffe60;
      pVar9.multiplier_ = (double)in_stack_fffffffffffffe68;
    }
    std::__cxx11::string::~string(pVar10._8_8_);
  }
  std::__cxx11::string::string
            (pVar9._8_8_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
  return in_RDI;
}

Assistant:

static std::string
    clean_unit_string(std::string propUnitString, std::uint32_t commodity)
{
    using spair = std::tuple<const char*, const char*, int, int>;
    static UNITS_CPP14_CONSTEXPR_OBJECT std::array<spair, 11> powerseq{
        {spair{"Mm^3", "(1e9km^3)", 4, 8},  // this needs to happen before ^3^2
                                            // conversions
         spair{"^2^2", "^4", 4, 2},
         spair{"^3^2", "^6", 4, 2},
         spair{"^2^3", "^6", 4, 2},
         spair{"^3^3", "^9", 4, 2},  // this can only happen with extended units
         spair{"Gs", "Bs", 2, 2},
         spair{"*K^", "*1*K^", 3, 5},  // this one is to prevent the next from
                                       // screwing things up
         spair{"eflag*K", "degC", 7, 4},
         spair{"*1*", "*", 3, 1},
         spair{"*1/", "/", 3, 1},
         spair{"*/", "/", 2, 1}}};
    // run a few checks for unusual conditions
    for (const auto& pseq : powerseq) {
        auto fnd = propUnitString.find(std::get<0>(pseq));
        while (fnd != std::string::npos) {
            propUnitString.replace(fnd, std::get<2>(pseq), std::get<1>(pseq));
            fnd =
                propUnitString.find(std::get<0>(pseq), fnd + std::get<3>(pseq));
        }
    }

    if (!propUnitString.empty()) {
        if (propUnitString.front() == '(' && propUnitString.back() == ')') {
            if (propUnitString.find_first_of('(', 1) == std::string::npos) {
                propUnitString.pop_back();
                propUnitString.erase(propUnitString.begin());
            }
        }
        if (propUnitString.find("00000") != std::string::npos) {
            reduce_number_length(propUnitString, '0');
        }
        if (propUnitString.find("99999") != std::string::npos) {
            reduce_number_length(propUnitString, '9');
        }
    }

    // no more cleaning necessary
    if (commodity == 0 && !propUnitString.empty() &&
        !isDigitCharacter(propUnitString.front())) {
        return propUnitString;
    }

    if (commodity != 0) {
        std::string cString = getCommodityName(
            ((commodity & 0x80000000) == 0) ? commodity : (~commodity));
        if (cString.compare(0, 7, "CXCOMM[") != 0) {
            // add some escapes for problematic sequences
            escapeString(cString);
        }
        // make it look like a commodity sequence
        cString.insert(cString.begin(), '{');
        cString.push_back('}');
        if ((commodity & 0x80000000) == 0) {
            auto loc = propUnitString.find_last_of("/^");
            if (loc == std::string::npos) {
                propUnitString += cString;
            } else if (propUnitString.compare(0, 2, "1/") == 0) {
                auto rs = checkForCustomUnit(cString);
                if (!is_error(rs)) {
                    cString.insert(0, 1, '1');
                }
                propUnitString.replace(0, 1, cString.c_str());
            } else {
                auto locp = propUnitString.find_first_of("^*/");
                if (propUnitString[locp] != '^' ||
                    propUnitString[locp + 1] != '-') {
                    propUnitString.insert(locp, cString);
                } else {
                    auto rs = checkForCustomUnit(cString);
                    if (!is_error(rs)) {
                        // this condition would take a very particular and odd
                        // string to trigger I haven't figured out a test case
                        // for it yet

                        // LCOV_EXCL_START
                        cString.insert(0, 1, '1');
                        // LCOV_EXCL_STOP
                    }
                    propUnitString = cString + "*" + propUnitString;
                }
            }
        } else {  // inverse commodity
            auto loc = propUnitString.find_last_of('/');
            if (loc == std::string::npos) {
                auto rs = checkForCustomUnit(cString);
                if (!is_error(rs)) {  // this check is needed because it is
                                      // possible to define a commodity that
                                      // would look like a form
                    // of custom unit
                    // The '1' forces the interpreter to interpret it as purely
                    // a commodity, but is only needed in very particular
                    // circumstances
                    cString.insert(0, 1, '1');
                }
                if (propUnitString.empty()) {
                    propUnitString.push_back('1');
                }
                propUnitString.push_back('/');
                propUnitString.append(cString);
            } else {
                auto locp = propUnitString.find_last_of("^*");
                if (locp == std::string::npos || locp < loc) {
                    propUnitString.append(cString);
                } else {
                    propUnitString.insert(locp, cString);
                }
            }
        }
    }
    return propUnitString;
}